

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O3

mg_connection *
mg_connect_client_secure
          (mg_client_options *client_options,char *error_buffer,size_t error_buffer_size)

{
  mg_connection *pmVar1;
  mg_error_data *in_RCX;
  mg_init_data local_18;
  
  local_18.callbacks = (mg_callbacks *)0x0;
  local_18.user_data = error_buffer;
  local_18.configuration_options = (char **)error_buffer_size;
  pmVar1 = mg_connect_client_impl(client_options,1,&local_18,in_RCX);
  return pmVar1;
}

Assistant:

mg_connection *
mg_connect_client_secure(const struct mg_client_options *client_options,
                         char *error_buffer,
                         size_t error_buffer_size)
{
	struct mg_init_data init;
	struct mg_error_data error;

	memset(&init, 0, sizeof(init));
	memset(&error, 0, sizeof(error));
	error.text_buffer_size = error_buffer_size;
	error.text = error_buffer;
	return mg_connect_client_impl(client_options, 1, &init, &error);
}